

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_timer_clear_all(void)

{
  int iVar1;
  fio_ls_embd_s *__ptr;
  fio_timer_s *timer;
  
  fio_lock(&fio_timer_lock);
  while( true ) {
    iVar1 = fio_ls_embd_any(&fio_timers);
    if (iVar1 == 0) break;
    __ptr = fio_ls_embd_pop(&fio_timers);
    if (__ptr[4].prev != (fio_ls_embd_s *)0x0) {
      (*(code *)__ptr[4].prev)(__ptr[3].next);
    }
    free(__ptr);
  }
  fio_unlock(&fio_timer_lock);
  return;
}

Assistant:

static void fio_timer_clear_all(void) {
  fio_lock(&fio_timer_lock);
  while (fio_ls_embd_any(&fio_timers)) {
    fio_timer_s *timer =
        FIO_LS_EMBD_OBJ(fio_timer_s, node, fio_ls_embd_pop(&fio_timers));
    if (timer->on_finish)
      timer->on_finish(timer->arg);
    free(timer);
  }
  fio_unlock(&fio_timer_lock);
}